

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O1

void __thiscall
DivideTest<unsigned_int>::test_random_numerators<(libdivide::Branching)1>
          (DivideTest<unsigned_int> *this,uint denom,
          divider<unsigned_int,_(libdivide::Branching)1> *the_divider)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  size_t i;
  long lVar5;
  
  lVar5 = 0;
  do {
    lVar4 = 0x10;
    do {
      uVar3 = this->seed * 0x19660d + 0x3c6ef35f;
      this->seed = uVar3;
      uVar2 = this->rand_n;
      uVar1 = ((uVar3 & 1) + 1) * uVar2 + 3 + uVar2 % 0x1c9c381;
      uVar3 = uVar3 % 0x13;
      if (uVar2 <= uVar1) {
        uVar3 = uVar1;
      }
      this->rand_n = uVar3;
      test_one<(libdivide::Branching)1>(this,uVar3,denom,the_divider);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 10000);
  return;
}

Assistant:

void test_random_numerators(T denom, const divider<T, ALGO> &the_divider) {
        for (size_t i = 0; i < 10000; ++i) {
            for (size_t j = 0; j < min_vector_count; j++) {
                test_one(get_random(), denom, the_divider);
            }
        }
    }